

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O0

get_result * __thiscall
unodb::
db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::get_internal(get_result *__return_storage_ptr__,
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *this,art_key_type k)

{
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> shifted_key;
  node_type type;
  bool bVar1;
  byte bVar2;
  byte key_byte;
  uint uVar3;
  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_00;
  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *this_01;
  find_result fVar4;
  in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_> *child;
  key_prefix_size key_prefix_length;
  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *key_prefix;
  inode<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *inode;
  pointer local_58;
  pointer local_50;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
  *local_48;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header> *leaf;
  undefined1 auStack_38 [7];
  node_type node_type;
  art_key_type remaining_key;
  node_ptr node;
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *this_local;
  art_key_type k_local;
  
  bVar1 = detail::basic_node_ptr<unodb::detail::node_header>::operator==(&this->root,(nullptr_t)0x0)
  ;
  if (bVar1) {
    std::optional<std::span<const_std::byte,_18446744073709551615UL>_>::optional
              (__return_storage_ptr__);
  }
  else {
    remaining_key.field_0.key._M_extent._M_extent_value =
         (__extent_storage<18446744073709551615UL>)(this->root).tagged_ptr;
    _auStack_38 = k.field_0._0_8_;
    remaining_key.field_0.key._M_ptr = k.field_0._8_8_;
    while (leaf._7_1_ = detail::basic_node_ptr<unodb::detail::node_header>::type
                                  ((basic_node_ptr<unodb::detail::node_header> *)
                                   &remaining_key.field_0.key._M_extent), leaf._7_1_ != LEAF) {
      if (leaf._7_1_ == LEAF) {
        __assert_fail("node_type != node_type::LEAF",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                      ,0x389,
                      "typename db<Key, Value>::get_result unodb::db<std::span<const std::byte>, std::span<const std::byte>>::get_internal(art_key_type) const [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                     );
      }
      this_00 = &detail::basic_node_ptr<unodb::detail::node_header>::
                 ptr<unodb::detail::inode<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>*>
                           ((basic_node_ptr<unodb::detail::node_header> *)
                            &remaining_key.field_0.key._M_extent)->
                 super_inode_base<std::span<const_std::byte>,_std::span<const_std::byte>_>;
      this_01 = detail::
                basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                ::get_key_prefix(this_00);
      bVar2 = detail::
              key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
              ::length((key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                        *)&this_01->f);
      shifted_key.field_0.key._M_extent._M_extent_value =
           (__extent_storage<18446744073709551615UL>)
           (__extent_storage<18446744073709551615UL>)remaining_key.field_0.key._M_ptr;
      shifted_key.field_0.key._M_ptr = (pointer)_auStack_38;
      uVar3 = detail::
              key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
              ::get_shared_length((key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                                   *)&this_01->f,shifted_key);
      if (uVar3 < bVar2) {
        std::optional<std::span<const_std::byte,_18446744073709551615UL>_>::optional
                  (__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::shift_right
                ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)auStack_38,
                 (ulong)bVar2);
      type = leaf._7_1_;
      key_byte = detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::
                 operator[]((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                            auStack_38,0);
      fVar4 = detail::
              basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
              ::find_child(this_00,type,key_byte);
      if ((in_fake_critical_section *)fVar4.second == (in_fake_critical_section *)0x0) {
        std::optional<std::span<const_std::byte,_18446744073709551615UL>_>::optional
                  (__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      remaining_key.field_0.key._M_extent._M_extent_value =
           (__extent_storage<18446744073709551615UL>)
           in_fake_critical_section::operator_cast_to_basic_node_ptr
                     ((in_fake_critical_section *)fVar4.second);
      detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::shift_right
                ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)auStack_38,1)
      ;
    }
    local_48 = detail::basic_node_ptr<unodb::detail::node_header>::
               ptr<unodb::detail::basic_leaf<std::span<std::byte_const,18446744073709551615ul>,unodb::detail::node_header>*>
                         ((basic_node_ptr<unodb::detail::node_header> *)
                          &remaining_key.field_0.key._M_extent);
    local_58 = k.field_0._0_8_;
    local_50 = k.field_0._8_8_;
    bVar1 = detail::
            basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
            ::matches(local_48,(art_key_type)k.field_0);
    if (bVar1) {
      _inode = detail::
               basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
               ::get_value_view(local_48);
      std::optional<std::span<const_std::byte,_18446744073709551615UL>_>::
      optional<std::span<const_std::byte,_18446744073709551615UL>,_true>
                (__return_storage_ptr__,(span<const_std::byte,_18446744073709551615UL> *)&inode);
    }
    else {
      std::optional<std::span<const_std::byte,_18446744073709551615UL>_>::optional
                (__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

typename db<Key, Value>::get_result db<Key, Value>::get_internal(
    art_key_type k) const noexcept {
  if (UNODB_DETAIL_UNLIKELY(root == nullptr)) return {};

  auto node{root};
  auto remaining_key{k};

  while (true) {
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      const auto* const leaf{node.template ptr<leaf_type*>()};
      if (leaf->matches(k)) return leaf->get_value_view();
      return {};
    }

    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);

    auto* const inode{node.template ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    if (key_prefix.get_shared_length(remaining_key) < key_prefix_length)
      return {};
    remaining_key.shift_right(key_prefix_length);
    const auto* const child{
        inode->find_child(node_type, remaining_key[0]).second};
    if (child == nullptr) return {};

    node = *child;
    remaining_key.shift_right(1);
  }
}